

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSimpleConfigCase.cpp
# Opt level: O2

void deqp::egl::getDefaultFilterLists
               (vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>
                *lists,FilterList *baseFilters)

{
  FilterList *pFVar1;
  long lVar2;
  long lVar3;
  string name;
  NamedFilterList filters;
  allocator<char> local_139;
  vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> *local_138;
  FilterList *local_130;
  long local_128;
  long local_120;
  anon_struct_16_2_3c8bed26 *local_118;
  char *local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  NamedFilterList local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  lVar2 = 0;
  local_138 = lists;
  local_130 = baseFilters;
  while (lVar2 != 5) {
    local_118 = getDefaultFilterLists::s_colorRules + lVar2;
    local_110 = getDefaultFilterLists::s_colorRules[lVar2].name;
    lVar3 = 0;
    local_128 = lVar2;
    while (lVar3 != 2) {
      local_120 = lVar3;
      for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 0x10) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,local_110,&local_139)
        ;
        std::operator+(&local_70,&local_90,"_");
        std::operator+(&local_50,&local_70,getDefaultFilterLists::s_depthRules[lVar3].name);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_e8,&local_50,"_");
        std::operator+(&local_108,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_e8,
                       *(char **)((long)&getDefaultFilterLists::s_stencilRules[0].name + lVar2));
        std::__cxx11::string::~string((string *)&local_e8);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_90);
        NamedFilterList::NamedFilterList(&local_e8,local_108._M_dataplus._M_p,"");
        pFVar1 = eglu::FilterList::operator<<(&local_e8.super_FilterList,local_130);
        pFVar1 = eglu::FilterList::operator<<(pFVar1,local_118->filter);
        pFVar1 = eglu::FilterList::operator<<
                           (pFVar1,getDefaultFilterLists::s_depthRules[lVar3].filter);
        pFVar1 = eglu::FilterList::operator<<
                           (pFVar1,*(ConfigFilter *)
                                    ((long)&getDefaultFilterLists::s_stencilRules[0].filter + lVar2)
                           );
        eglu::FilterList::operator<<(pFVar1,isConformant);
        std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>::
        push_back(local_138,&local_e8);
        NamedFilterList::~NamedFilterList(&local_e8);
        std::__cxx11::string::~string((string *)&local_108);
      }
      lVar3 = local_120 + 1;
    }
    lVar2 = local_128 + 1;
  }
  NamedFilterList::NamedFilterList(&local_e8,"other","All other configs");
  pFVar1 = eglu::FilterList::operator<<(&local_e8.super_FilterList,local_130);
  pFVar1 = eglu::FilterList::operator<<(pFVar1,notColorBits<5,6,5,0>);
  pFVar1 = eglu::FilterList::operator<<(pFVar1,notColorBits<8,8,8,0>);
  pFVar1 = eglu::FilterList::operator<<(pFVar1,notColorBits<4,4,4,4>);
  pFVar1 = eglu::FilterList::operator<<(pFVar1,notColorBits<5,5,5,1>);
  pFVar1 = eglu::FilterList::operator<<(pFVar1,notColorBits<8,8,8,8>);
  pFVar1 = eglu::FilterList::operator<<(pFVar1,isConformant);
  eglu::FilterList::operator<<(pFVar1,notFloat);
  std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>::push_back
            (local_138,&local_e8);
  NamedFilterList::~NamedFilterList(&local_e8);
  return;
}

Assistant:

void getDefaultFilterLists (vector<NamedFilterList>& lists, const FilterList& baseFilters)
{
	static const struct
	{
		const char*			name;
		eglu::ConfigFilter	filter;
	} s_colorRules[] =
	{
		{ "rgb565",		colorBits<5, 6, 5, 0> },
		{ "rgb888",		colorBits<8, 8, 8, 0> },
		{ "rgba4444",	colorBits<4, 4, 4, 4> },
		{ "rgba5551",	colorBits<5, 5, 5, 1> },
		{ "rgba8888",	colorBits<8, 8, 8, 8> }
	};

	static const struct
	{
		const char*			name;
		eglu::ConfigFilter	filter;
	} s_depthRules[] =
	{
		{ "no_depth",	noDepth		},
		{ "depth",		hasDepth	},
	};

	static const struct
	{
		const char*			name;
		eglu::ConfigFilter	filter;
	} s_stencilRules[] =
	{
		{ "no_stencil",	noStencil	},
		{ "stencil",	hasStencil	},
	};

	for (int colorRuleNdx = 0; colorRuleNdx < DE_LENGTH_OF_ARRAY(s_colorRules); colorRuleNdx++)
	{
		for (int depthRuleNdx = 0; depthRuleNdx < DE_LENGTH_OF_ARRAY(s_depthRules); depthRuleNdx++)
		{
			for (int stencilRuleNdx = 0; stencilRuleNdx < DE_LENGTH_OF_ARRAY(s_stencilRules); stencilRuleNdx++)
			{
				const string		name		= string(s_colorRules[colorRuleNdx].name) + "_" + s_depthRules[depthRuleNdx].name + "_" + s_stencilRules[stencilRuleNdx].name;
				NamedFilterList		filters		(name.c_str(), "");

				filters << baseFilters
						<< s_colorRules[colorRuleNdx].filter
						<< s_depthRules[depthRuleNdx].filter
						<< s_stencilRules[stencilRuleNdx].filter
						<< isConformant;

				lists.push_back(filters);
			}
		}
	}

	// Build "other" set - not configs that don't match any of known color rules
	{
		NamedFilterList		filters		("other", "All other configs");

		// \todo [2014-12-18 pyry] Optimize rules
		filters << baseFilters
				<< notColorBits<5, 6, 5, 0>
				<< notColorBits<8, 8, 8, 0>
				<< notColorBits<4, 4, 4, 4>
				<< notColorBits<5, 5, 5, 1>
				<< notColorBits<8, 8, 8, 8>
				<< isConformant
				<< notFloat;

		lists.push_back(filters);
	}
}